

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

bool S_ChangeMusic(char *musicname,int order,bool looping,bool force)

{
  MusInfo *this;
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FString *this_00;
  char *pcVar5;
  ulong uVar6;
  float fVar7;
  FWadLump *local_90;
  FileReader *reader;
  MidiDeviceSetting *local_80;
  MidiDeviceSetting *devp;
  MusInfo *handle;
  int local_68;
  int length;
  int lumpnum;
  uint id;
  char *more;
  undefined4 local_50;
  int track;
  FName *local_48;
  FName *aliasp;
  char *local_30;
  char *mus_string;
  FString DEH_Music;
  bool force_local;
  bool looping_local;
  char *pcStack_18;
  int order_local;
  char *musicname_local;
  
  if ((!force) && (PlayList != (FPlayList *)0x0)) {
    return false;
  }
  DEH_Music.Chars._2_1_ = force;
  DEH_Music.Chars._3_1_ = looping;
  DEH_Music.Chars._4_4_ = order;
  pcStack_18 = musicname;
  if ((musicname != (char *)0x0) && (iVar3 = strcmp(musicname,"*"), iVar3 == 0)) {
    if ((gamestate == GS_LEVEL) || (gamestate == GS_TITLELEVEL)) {
      pcStack_18 = FString::operator_cast_to_char_(&level.Music);
      DEH_Music.Chars._4_4_ = level.musicorder;
    }
    else {
      pcStack_18 = (char *)0x0;
    }
  }
  if ((pcStack_18 == (char *)0x0) || (*pcStack_18 == '\0')) {
    S_StopMusic(true);
    FString::operator=(&mus_playing.name,"");
    FString::operator=(&LastSong,"");
    return true;
  }
  FString::FString((FString *)&mus_string);
  if ((*pcStack_18 == '$') &&
     (local_30 = FStringTable::operator[](&GStrings,pcStack_18 + 1), local_30 != (char *)0x0)) {
    this_00 = FString::operator<<((FString *)&mus_string,"D_");
    FString::operator<<(this_00,local_30);
    pcStack_18 = FString::operator_cast_to_char_((FString *)&mus_string);
  }
  FName::FName((FName *)&track,pcStack_18);
  local_48 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::CheckKey
                       (&MusicAliases,(FName *)&track);
  if (local_48 != (FName *)0x0) {
    bVar2 = FName::operator==(local_48,NAME_None);
    if (bVar2) {
      musicname_local._7_1_ = true;
      goto LAB_003a81d1;
    }
    pcStack_18 = FName::GetChars(local_48);
  }
  bVar2 = FString::IsEmpty(&mus_playing.name);
  if ((!bVar2) && (mus_playing.handle != (MusInfo *)0x0)) {
    pcVar5 = FString::operator_cast_to_char_(&mus_playing.name);
    iVar3 = strcasecmp(pcVar5,pcStack_18);
    if ((iVar3 == 0) && (((mus_playing.handle)->m_Looping & 1U) == (DEH_Music.Chars._3_1_ & 1))) {
      if (DEH_Music.Chars._4_4_ == mus_playing.baseorder) {
        uVar4 = (*(mus_playing.handle)->_vptr_MusInfo[8])();
        if ((uVar4 & 1) == 0) {
          (*(mus_playing.handle)->_vptr_MusInfo[4])
                    (mus_playing.handle,(ulong)(DEH_Music.Chars._3_1_ & 1),
                     (ulong)DEH_Music.Chars._4_4_);
        }
      }
      else {
        uVar4 = (*(mus_playing.handle)->_vptr_MusInfo[0xc])
                          (mus_playing.handle,(ulong)DEH_Music.Chars._4_4_);
        if ((uVar4 & 1) != 0) {
          mus_playing.baseorder = DEH_Music.Chars._4_4_;
        }
      }
      musicname_local._7_1_ = true;
      goto LAB_003a81d1;
    }
  }
  iVar3 = strncasecmp(pcStack_18,",CD,",4);
  if (iVar3 == 0) {
    uVar6 = strtoul(pcStack_18 + 4,(char **)0x0,0);
    more._4_4_ = (int)uVar6;
    _lumpnum = strchr(pcStack_18 + 4,0x2c);
    length = 0;
    if (_lumpnum != (char *)0x0) {
      uVar6 = strtoul(_lumpnum + 1,(char **)0x0,0x10);
      length = (int)uVar6;
    }
    S_StopMusic(true);
    mus_playing.handle = I_RegisterCDSong(more._4_4_,length);
  }
  else {
    local_68 = -1;
    handle._4_4_ = 0;
    devp = (MidiDeviceSetting *)0x0;
    FName::FName((FName *)((long)&reader + 4),pcStack_18);
    local_80 = TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
               ::CheckKey(&MidiDevices,(FName *)((long)&reader + 4));
    iVar3 = strncmp(pcStack_18,"file://",7);
    if (iVar3 == 0) {
      pcStack_18 = pcStack_18 + 7;
    }
    local_90 = (FWadLump *)0x0;
    bVar2 = FileExists(pcStack_18);
    if (bVar2) {
      local_90 = (FWadLump *)operator_new(0x30);
      FileReader::FileReader((FileReader *)local_90,pcStack_18);
    }
    else {
      local_68 = FWadCollection::CheckNumForFullName(&Wads,pcStack_18,true,0x10);
      if (local_68 == -1) {
        pcVar5 = strstr(pcStack_18,"://");
        if (pcVar5 <= pcStack_18) {
          Printf("Music \"%s\" not found\n",pcStack_18);
          musicname_local._7_1_ = false;
          goto LAB_003a81d1;
        }
        devp = (MidiDeviceSetting *)I_RegisterURLSong(pcStack_18);
        if ((MusInfo *)devp == (MusInfo *)0x0) {
          Printf("Could not open \"%s\"\n",pcStack_18);
          musicname_local._7_1_ = false;
          goto LAB_003a81d1;
        }
      }
      if (devp == (MidiDeviceSetting *)0x0) {
        iVar3 = FWadCollection::LumpLength(&Wads,local_68);
        if (iVar3 == 0) {
          musicname_local._7_1_ = false;
          goto LAB_003a81d1;
        }
        local_90 = FWadCollection::ReopenLumpNumNewFile(&Wads,local_68);
        if (local_90 == (FWadLump *)0x0) {
          musicname_local._7_1_ = false;
          goto LAB_003a81d1;
        }
      }
    }
    S_StopMusic(true);
    fVar7 = FFloatCVar::operator_cast_to_float(&snd_musicvolume);
    if (fVar7 <= 0.0) {
      mus_playing.loop = (bool)(DEH_Music.Chars._3_1_ & 1);
      FString::operator=(&mus_playing.name,pcStack_18);
      mus_playing.baseorder = DEH_Music.Chars._4_4_;
      FString::operator=(&LastSong,pcStack_18);
      if (local_90 != (FWadLump *)0x0) {
        (*(local_90->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])();
      }
      musicname_local._7_1_ = true;
      goto LAB_003a81d1;
    }
    if (devp == (MidiDeviceSetting *)0x0) {
      mus_playing.handle = I_RegisterSong(&local_90->super_FileReader,local_80);
    }
    else {
      mus_playing.handle = (MusInfo *)devp;
      if (local_90 != (FWadLump *)0x0) {
        (*(local_90->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])();
      }
    }
  }
  mus_playing.loop = (bool)(DEH_Music.Chars._3_1_ & 1);
  FString::operator=(&mus_playing.name,pcStack_18);
  mus_playing.baseorder = 0;
  FString::operator=(&LastSong,"");
  bVar1 = DEH_Music.Chars._3_1_;
  this = mus_playing.handle;
  if (mus_playing.handle == (MusInfo *)0x0) {
    musicname_local._7_1_ = false;
  }
  else {
    fVar7 = S_GetMusicVolume(pcStack_18);
    MusInfo::Start(this,(bool)(bVar1 & 1),fVar7,DEH_Music.Chars._4_4_);
    mus_playing.baseorder = DEH_Music.Chars._4_4_;
    musicname_local._7_1_ = true;
  }
LAB_003a81d1:
  local_50 = 1;
  FString::~FString((FString *)&mus_string);
  return musicname_local._7_1_;
}

Assistant:

bool S_ChangeMusic (const char *musicname, int order, bool looping, bool force)
{
	if (!force && PlayList)
	{ // Don't change if a playlist is active
		return false;
	}

	// allow specifying "*" as a placeholder to play the level's default music.
	if (musicname != NULL && !strcmp(musicname, "*"))
	{
		if (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL)
		{
			musicname = level.Music;
			order = level.musicorder;
		}
		else
		{
			musicname = NULL;
		}
	}

	if (musicname == NULL || musicname[0] == 0)
	{
		// Don't choke if the map doesn't have a song attached
		S_StopMusic (true);
		mus_playing.name = "";
		LastSong = "";
		return true;
	}

	FString DEH_Music;
	if (musicname[0] == '$')
	{
		// handle dehacked replacement.
		// Any music name defined this way needs to be prefixed with 'D_' because
		// Doom.exe does not contain the prefix so these strings don't either.
		const char * mus_string = GStrings[musicname+1];
		if (mus_string != NULL)
		{
			DEH_Music << "D_" << mus_string;
			musicname = DEH_Music;
		}
	}

	FName *aliasp = MusicAliases.CheckKey(musicname);
	if (aliasp != NULL) 
	{
		if (*aliasp == NAME_None)
		{
			return true;	// flagged to be ignored
		}
		musicname = aliasp->GetChars();
	}

	if (!mus_playing.name.IsEmpty() &&
		mus_playing.handle != NULL &&
		stricmp (mus_playing.name, musicname) == 0 &&
		mus_playing.handle->m_Looping == looping)
	{
		if (order != mus_playing.baseorder)
		{
			if (mus_playing.handle->SetSubsong(order))
			{
				mus_playing.baseorder = order;
			}
		}
		else if (!mus_playing.handle->IsPlaying())
		{
			mus_playing.handle->Play(looping, order);
		}
		return true;
	}

	if (strnicmp (musicname, ",CD,", 4) == 0)
	{
		int track = strtoul (musicname+4, NULL, 0);
		const char *more = strchr (musicname+4, ',');
		unsigned int id = 0;

		if (more != NULL)
		{
			id = strtoul (more+1, NULL, 16);
		}
		S_StopMusic (true);
		mus_playing.handle = I_RegisterCDSong (track, id);
	}
	else
	{
		int lumpnum = -1;
		int length = 0;
		MusInfo *handle = NULL;
		MidiDeviceSetting *devp = MidiDevices.CheckKey(musicname);

		// Strip off any leading file:// component.
		if (strncmp(musicname, "file://", 7) == 0)
		{
			musicname += 7;
		}

		FileReader *reader = NULL;
		if (!FileExists (musicname))
		{
			if ((lumpnum = Wads.CheckNumForFullName (musicname, true, ns_music)) == -1)
			{
				if (strstr(musicname, "://") > musicname)
				{
					// Looks like a URL; try it as such.
					handle = I_RegisterURLSong(musicname);
					if (handle == NULL)
					{
						Printf ("Could not open \"%s\"\n", musicname);
						return false;
					}
				}
				else
				{
					Printf ("Music \"%s\" not found\n", musicname);
					return false;
				}
			}
			if (handle == NULL)
			{
				if (Wads.LumpLength (lumpnum) == 0)
				{
					return false;
				}
				reader = Wads.ReopenLumpNumNewFile(lumpnum);
				if (reader == NULL)
				{
					return false;
				}
			}
		}
		else
		{
			// Load an external file.
			reader = new FileReader(musicname);
		}

		// shutdown old music
		S_StopMusic (true);

		// Just record it if volume is 0
		if (snd_musicvolume <= 0)
		{
			mus_playing.loop = looping;
			mus_playing.name = musicname;
			mus_playing.baseorder = order;
			LastSong = musicname;
			delete reader;
			return true;
		}

		// load & register it
		if (handle != NULL)
		{
			mus_playing.handle = handle;
			delete reader;
		}
		else
		{
			mus_playing.handle = I_RegisterSong (reader, devp);
		}
	}

	mus_playing.loop = looping;
	mus_playing.name = musicname;
	mus_playing.baseorder = 0;
	LastSong = "";

	if (mus_playing.handle != 0)
	{ // play it
		mus_playing.handle->Start(looping, S_GetMusicVolume (musicname), order);
		mus_playing.baseorder = order;
		return true;
	}
	return false;
}